

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

ParseStatus
re2::ParseCCName(StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  int iVar1;
  char *offset;
  char *pcVar2;
  UGroup *g_00;
  bool bVar3;
  UGroup *g;
  StringPiece name;
  char *q;
  char *ep;
  char *p;
  RegexpStatus *status_local;
  CharClassBuilder *cc_local;
  ParseFlags parse_flags_local;
  StringPiece *s_local;
  
  offset = StringPiece::data(s);
  pcVar2 = StringPiece::data(s);
  iVar1 = StringPiece::size(s);
  if ((((long)(pcVar2 + ((long)iVar1 - (long)offset)) < 2) || (*offset != '[')) ||
     (offset[1] != ':')) {
    s_local._4_4_ = kParseNothing;
  }
  else {
    name._8_8_ = offset + 2;
    while( true ) {
      bVar3 = false;
      if (((ulong)name._8_8_ <= pcVar2 + (long)iVar1 + -2) &&
         (bVar3 = true, *(char *)name._8_8_ == ':')) {
        bVar3 = *(char *)(name._8_8_ + 1) != ']';
      }
      if (!bVar3) break;
      name._8_8_ = name._8_8_ + 1;
    }
    if (pcVar2 + (long)iVar1 + -2 < (ulong)name._8_8_) {
      s_local._4_4_ = kParseNothing;
    }
    else {
      name._8_8_ = name._8_8_ + 2;
      StringPiece::StringPiece((StringPiece *)&g,offset,(int)name._8_8_ - (int)offset);
      g_00 = LookupPosixGroup((StringPiece *)&g);
      if (g_00 == (UGroup *)0x0) {
        RegexpStatus::set_code(status,kRegexpBadCharRange);
        RegexpStatus::set_error_arg(status,(StringPiece *)&g);
        s_local._4_4_ = kParseError;
      }
      else {
        iVar1 = StringPiece::size((StringPiece *)&g);
        StringPiece::remove_prefix(s,iVar1);
        AddUGroup(cc,g_00,g_00->sign,parse_flags);
        s_local._4_4_ = kParseOk;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static ParseStatus ParseCCName(StringPiece* s, Regexp::ParseFlags parse_flags,
                               CharClassBuilder *cc,
                               RegexpStatus* status) {
  // Check begins with [:
  const char* p = s->data();
  const char* ep = s->data() + s->size();
  if (ep - p < 2 || p[0] != '[' || p[1] != ':')
    return kParseNothing;

  // Look for closing :].
  const char* q;
  for (q = p+2; q <= ep-2 && (*q != ':' || *(q+1) != ']'); q++)
    ;

  // If no closing :], then ignore.
  if (q > ep-2)
    return kParseNothing;

  // Got it.  Check that it's valid.
  q += 2;
  StringPiece name(p, static_cast<int>(q-p));

  const UGroup *g = LookupPosixGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(name);
    return kParseError;
  }

  s->remove_prefix(name.size());
  AddUGroup(cc, g, g->sign, parse_flags);
  return kParseOk;
}